

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.cpp
# Opt level: O3

bool __thiscall HTTPServerPlugin::initialize(HTTPServerPlugin *this)

{
  undefined1 uVar1;
  undefined2 uVar2;
  const_iterator cVar3;
  undefined1 auVar4 [16];
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  auVar4 = Jupiter::Config::get(&this->field_0x38,0xb,"BindAddress",7,"0.0.0.0");
  local_28._M_len = 8;
  local_28._M_str = "BindPort";
  cVar3 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_28);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    uVar2 = 0x50;
  }
  else {
    uVar2 = Jupiter_strtoui_s(*(undefined8 *)
                               ((long)cVar3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                      ._M_cur + 0x28),
                              *(undefined8 *)
                               ((long)cVar3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                      ._M_cur + 0x30),0);
  }
  uVar1 = Jupiter::HTTP::Server::bind(&this->server,auVar4._0_8_,auVar4._8_8_,uVar2);
  return (bool)uVar1;
}

Assistant:

bool HTTPServerPlugin::initialize() {
	return HTTPServerPlugin::server.bind(this->config.get("BindAddress"sv, "0.0.0.0"sv), this->config.get<uint16_t>("BindPort"sv, 80));
}